

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O2

void parseMap(char *loadDir,MapList *mapList,Dialog *dialog)

{
  Map *__dest;
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *__s;
  size_t sVar5;
  DIR *__dirp;
  dirent *pdVar6;
  FILE *__stream;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  long lVar10;
  int i;
  char *textBox [3];
  regex_t riotExt;
  char line [80];
  char path [4096];
  
  regcomp((regex_t *)&riotExt,"(\\.)?[0-9](.riot)$",9);
  mapList->count = 0;
  __s = loadDir;
  if (loadDir == (char *)0x0) {
    __s = getcwd((char *)0x0,0x1000);
    sVar5 = strlen(__s);
    builtin_strncpy(__s + sVar5,"/assets",8);
  }
  __dirp = opendir(__s);
  if (__dirp == (DIR *)0x0) {
    bVar9 = true;
  }
  else {
    bVar9 = true;
    while (pdVar6 = readdir(__dirp), pdVar6 != (dirent *)0x0) {
      sprintf(path,"%s/%s",__s);
      iVar2 = regexec((regex_t *)&riotExt,pdVar6->d_name,0,(regmatch_t *)0x0,0);
      if ((iVar2 == 0) && (__stream = fopen(path,"r"), __stream != (FILE *)0x0)) {
        fseek(__stream,0,2);
        lVar7 = ftell(__stream);
        if (0x608 < lVar7) {
          rewind(__stream);
          cVar1 = pdVar6->d_name[0];
          if (cVar1 == '.') {
            cVar1 = pdVar6->d_name[1];
          }
          iVar2 = cVar1 + -0x30;
          __dest = mapList->level + iVar2;
          mapList->level[iVar2].levelNo = iVar2;
          fgets(line,0x50,__stream);
          strtok(line,"]");
          pcVar8 = strtok((char *)0x0,"\n");
          strcpy(__dest->name,pcVar8);
          fgets(line,0x50,__stream);
          strtok(line,"]");
          pcVar8 = strtok((char *)0x0,"\n");
          iVar3 = atoi(pcVar8);
          mapList->level[iVar2].repMax = iVar3;
          fgets(line,0x50,__stream);
          strtok(line,"]");
          pcVar8 = strtok((char *)0x0,"\n");
          iVar3 = atoi(pcVar8);
          mapList->level[iVar2].panicMax = iVar3;
          fgets(line,0x50,__stream);
          strtok(line,"]");
          pcVar8 = strtok((char *)0x0,"\n");
          strcpy(mapList->level[iVar2].inmates,pcVar8);
          do {
            iVar2 = fgetc(__stream);
          } while (iVar2 == 0x3e);
          for (lVar7 = 0; lVar7 != 0x490; lVar7 = lVar7 + 0x49) {
            fgets(__dest->overlay[0] + lVar7,0x48,__stream);
            fseek(__stream,2,1);
          }
          iVar2 = __dest->levelNo;
          textBox[0] = dialog[iVar2].textIntro;
          textBox[1] = dialog[iVar2].textWin;
          textBox[2] = dialog[iVar2].textLose;
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            do {
              uVar4 = fgetc(__stream);
            } while ((char)uVar4 == '>');
            if ((uVar4 & 0xff) == 0) {
              *textBox[lVar7] = '\0';
            }
            else {
              lVar10 = 0;
              while( true ) {
                iVar2 = fgetc(__stream);
                if ((char)iVar2 == '>') break;
                textBox[lVar7][lVar10] = (char)iVar2;
                lVar10 = lVar10 + 1;
              }
            }
          }
          fclose(__stream);
          mapList->count = mapList->count + 1;
          bVar9 = false;
        }
      }
    }
  }
  closedir(__dirp);
  regfree((regex_t *)&riotExt);
  if (loadDir == (char *)0x0) {
    free(__s);
  }
  if (bVar9) {
    quit("No map files found");
  }
  return;
}

Assistant:

void parseMap(char *loadDir, struct MapList *mapList, struct Dialog *dialog) {

    FILE *file;
    DIR *directory;
    regex_t riotExt;

    struct Map *current;
    struct dirent *entry;

    char path[PATH_MAX];
    char line[MAX_COLS];
    char *textBox[3];
    char checkChar;
    bool useCwd = false;
    bool firstRun = true;

    int x, y;

    /* Compile regex */
    regcomp(&riotExt, REGEX_EXT, REG_NOSUB | REG_EXTENDED);

    /* Create a new mapList to store map file details */
    mapList->count = 0;

    /* Use map directory passed as argument if provided, else cwd */
    if (!loadDir) {
        loadDir = getcwd(loadDir, PATH_MAX);
        strcat(loadDir,"/assets");
        useCwd = true;
    }

    /* Attempt to iterate through files in loadDir */
    if ((directory = opendir(loadDir)))

        while ((entry = readdir(directory))) {
            sprintf(path, "%s/%s", loadDir, entry->d_name);

            /* Skip if not readable .riot# file */
            if (regexec(&riotExt, entry->d_name, 0, NULL, 0)) continue;
            if (!(file = fopen(path, "r"))) continue;
            fseek(file, 0, SEEK_END);
            if (ftell(file) < MAP_SIZE) continue;
            rewind(file);
            /* Determine level number from filename*/
            if (entry->d_name[0] == '.') {
                current = &mapList->level[entry->d_name[1] - '0'];
                current->levelNo = entry->d_name[1] - '0';
            } else {
                current = &mapList->level[entry->d_name[0] - '0'];
                current->levelNo = entry->d_name[0] - '0';
            }

            /* Get level name */
            fgets(line, MAX_COLS, file);
            strtok(line, "]");
            strcpy(current->name, strtok(NULL, "\n"));

            /* Get rep */
            fgets(line, MAX_COLS, file);
            strtok(line, "]");
            current->repMax = atoi(strtok(NULL, "\n"));

            /* Get panic */
            fgets(line, MAX_COLS, file);
            strtok(line, "]");
            current->panicMax = atoi(strtok(NULL, "\n"));

            /* Get units */
            fgets(line, MAX_COLS, file);
            strtok(line, "]");
            strcpy(current->inmates, strtok(NULL, "\n"));

            /* Get map */
            while ((fgetc(file) == '>'));
            for (y = 0; y < MAP_ROWS; y++) {
                fgets(current->overlay[y], MAP_COLS, file);
                fseek(file, 2, SEEK_CUR);
            }

            /* Get text boxes*/
            textBox[0] = dialog[current->levelNo].textIntro;
            textBox[1] = dialog[current->levelNo].textWin;
            textBox[2] = dialog[current->levelNo].textLose;

            for (int i = 0; i < 3; i++) {
                x = 0;
                do checkChar = fgetc(file); while (checkChar == '>');
                if (checkChar == '\0') strcpy(textBox[i], "");
                else
                    while ((checkChar = fgetc(file)) != '>') {
                        textBox[i][x++] = checkChar;
                    }
            }

            fclose(file);
            mapList->count++;
            firstRun = false;
        }

    /* Clean up memory */
    closedir(directory);
    regfree(&riotExt);
    if (useCwd) free(loadDir); //getcwd calls malloc, if used must free loadDir

    /* Terminate if no map files where found */
    if (firstRun) {
        quit("No map files found");
    }

    return;
}